

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void explainTempTable(Parse *pParse,char *zUsage)

{
  char *pcVar1;
  Vdbe *in_RSI;
  undefined8 *in_RDI;
  int unaff_retaddr;
  char *zMsg;
  Vdbe *v;
  undefined4 in_stack_ffffffffffffffdc;
  undefined8 uVar2;
  
  if (*(char *)((long)in_RDI + 0x1f2) == '\x02') {
    uVar2 = in_RDI[2];
    pcVar1 = sqlite3MPrintf((sqlite3 *)*in_RDI,"USE TEMP B-TREE FOR %s",in_RSI);
    sqlite3VdbeAddOp4(in_RSI,(int)((ulong)uVar2 >> 0x20),(int)uVar2,(int)((ulong)pcVar1 >> 0x20),
                      (int)pcVar1,(char *)CONCAT44(in_stack_ffffffffffffffdc,0xffffffff),
                      unaff_retaddr);
  }
  return;
}

Assistant:

static void explainTempTable(Parse *pParse, const char *zUsage){
  if( pParse->explain==2 ){
    Vdbe *v = pParse->pVdbe;
    char *zMsg = sqlite3MPrintf(pParse->db, "USE TEMP B-TREE FOR %s", zUsage);
    sqlite3VdbeAddOp4(v, OP_Explain, pParse->iSelectId, 0, 0, zMsg, P4_DYNAMIC);
  }
}